

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

void VW::read_line_decision_service_json<false>
               (vw *all,v_array<example_*> *examples,char *line,size_t length,bool copy_line,
               example_factory_t example_factory,void *ex_factory_context,
               DecisionServiceInteraction *data)

{
  BaseState<false> *pBVar1;
  ostream *poVar2;
  char *pcVar3;
  vw_exception *this;
  undefined3 in_register_00000081;
  ParseResult PVar4;
  InsituStringStream ss;
  stringstream __msg;
  char *local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  GenericInsituStringStream<rapidjson::UTF8<char>_> local_430;
  char *local_418;
  long local_410;
  char local_408 [16];
  string local_3f8;
  undefined8 local_3d8;
  void *pvStack_3d0;
  void *local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  undefined8 local_3a0;
  Context<false> CStack_398;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  local_448 = (char *)0x0;
  uStack_440 = 0;
  local_438 = 0;
  if (CONCAT31(in_register_00000081,copy_line) != 0) {
    std::vector<char,std::allocator<char>>::_M_range_insert<char*>
              ((vector<char,std::allocator<char>> *)&local_448,0,line);
    line = local_448;
  }
  local_430.dst_ = (Ch *)0x0;
  CStack_398.current_state = &CStack_398.default_state.super_BaseState<false>;
  local_3b8 = 0;
  local_3c8 = (void *)0x0;
  uStack_3c0 = 0;
  local_3d8 = 0;
  pvStack_3d0 = (void *)0x0;
  local_3b0 = 0x100;
  local_3a8 = 0;
  CStack_398.namespace_path.super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  CStack_398.namespace_path.super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  CStack_398.namespace_path.super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a0 = 0;
  CStack_398.error_ptr._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  CStack_398.default_state.super_BaseState<false>.name = "Default";
  CStack_398.default_state.super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002ea188
  ;
  CStack_398.label_state.super_BaseState<false>.name = "Label";
  CStack_398.label_state.super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002ea270;
  CStack_398.label_object_state.super_BaseState<false>.name = "LabelObject";
  CStack_398.label_object_state.super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002ea2e8;
  CStack_398.label_single_property_state.super_BaseState<false>.name = "LabelSingleProperty";
  CStack_398.label_single_property_state.super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002ea360;
  CStack_398.label_index_state.super_BaseState<false>.name = "LabelIndex";
  CStack_398.label_index_state.super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002ea3d8;
  CStack_398.label_index_state.index = -1;
  CStack_398.text_state.super_BaseState<false>.name = "text";
  CStack_398.text_state.super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002ea450;
  CStack_398.tag_state.super_BaseState<false>.name = "tag";
  CStack_398.tag_state.super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002ea4c8;
  CStack_398.multi_state.super_BaseState<false>.name = "Multi";
  CStack_398.multi_state.super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002ea540;
  CStack_398.ignore_state.super_BaseState<false>.name = "Ignore";
  CStack_398.ignore_state.super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002ea5b8;
  CStack_398.array_state.super_BaseState<false>.name = "Array";
  CStack_398.array_state.super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002ea630;
  CStack_398.decision_service_state.super_BaseState<false>.name = "DecisionService";
  CStack_398.decision_service_state.super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002ea6a8;
  CStack_398.array_float_state.super_BaseState<false>.name = "ArrayToVectorState";
  CStack_398.array_float_state.super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002ea720;
  CStack_398.array_uint_state.super_BaseState<false>.name = "ArrayToVectorState";
  CStack_398.array_uint_state.super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002ea798;
  CStack_398.string_state.super_BaseState<false>.name = "StringToStringState";
  CStack_398.string_state.super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002ea810;
  CStack_398.float_state.super_BaseState<false>.name = "FloatToFloatState";
  CStack_398.float_state.super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002ea888;
  CStack_398.bool_state.super_BaseState<false>.name = "BoolToBoolState";
  CStack_398.bool_state.super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002ea900;
  CStack_398.key = " ";
  CStack_398.key_length = 1;
  CStack_398.previous_state = (BaseState<false> *)0x0;
  CStack_398.label_object_state.cb_label.cost = 0.0;
  CStack_398.label_object_state.cb_label.action = 0;
  CStack_398.label_object_state.cb_label.probability = 0.0;
  CStack_398.label_object_state.cb_label.partial_prediction = 0.0;
  CStack_398.label_object_state.found = false;
  CStack_398.label_object_state.found_cb = false;
  CStack_398.ex = *examples->_begin;
  local_430.src_ = line;
  local_430.head_ = line;
  CStack_398.all = all;
  CStack_398.examples = examples;
  CStack_398.root_state = CStack_398.current_state;
  (*(all->p->lp).default_label)(&(CStack_398.ex)->l);
  CStack_398.current_state = &CStack_398.decision_service_state.super_BaseState<false>;
  CStack_398.stream_end = line + length;
  CStack_398.stream = &local_430;
  CStack_398.example_factory_context = ex_factory_context;
  CStack_398.decision_service_state.data = data;
  CStack_398.example_factory = example_factory;
  CStack_398.root_state = CStack_398.current_state;
  PVar4 = rapidjson::
          GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                    ((GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                      *)&local_3d8,CStack_398.stream,(VWReaderHandler<false> *)&CStack_398);
  pBVar1 = CStack_398.current_state;
  if (PVar4.code_ == kParseErrorNone) {
    if (CStack_398.namespace_path.
        super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(CStack_398.namespace_path.
                      super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (CStack_398.error_ptr._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)CStack_398.error_ptr._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    CStack_398.error_ptr._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    free(local_3c8);
    if (pvStack_3d0 != (void *)0x0) {
      operator_delete(pvStack_3d0);
    }
    if (local_448 != (char *)0x0) {
      operator_delete(local_448);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"JSON parser error at ",0x15);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  pcVar3 = rapidjson::GetParseError_En(PVar4.code_);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,". Handler: ",0xb);
  Context<false>::error_abi_cxx11_(&CStack_398);
  std::__cxx11::stringbuf::str();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_418,local_410);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"State: ",7);
  if (pBVar1 == (BaseState<false> *)0x0) {
    pcVar3 = "null";
  }
  else {
    pcVar3 = pBVar1->name;
  }
  std::operator<<(poVar2,pcVar3);
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_example_json.h"
             ,0x488,&local_3f8);
  __cxa_throw(this,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void read_line_decision_service_json(vw& all, v_array<example*>& examples, char* line, size_t length, bool copy_line,
    example_factory_t example_factory, void* ex_factory_context, DecisionServiceInteraction* data)
{
  std::vector<char> line_vec;
  if (copy_line)
  {
    line_vec.insert(line_vec.end(), line, line + length);
    line = &line_vec.front();
  }

  InsituStringStream ss(line);
  json_parser<audit> parser;

  VWReaderHandler<audit>& handler = parser.handler;
  handler.init(&all, &examples, &ss, line + length, example_factory, ex_factory_context);
  handler.ctx.SetStartStateToDecisionService(data);

  ParseResult result =
      parser.reader.template Parse<kParseInsituFlag, InsituStringStream, VWReaderHandler<audit>>(ss, handler);

  if (!result.IsError())
    return;

  BaseState<audit>* current_state = handler.current_state();

  THROW("JSON parser error at " << result.Offset() << ": " << GetParseError_En(result.Code())
                                << ". "
                                   "Handler: "
                                << handler.error().str()
                                << "State: " << (current_state ? current_state->name : "null"));
}